

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall
QMainWindowLayout::addToolBar
          (QMainWindowLayout *this,ToolBarArea area,QToolBar *toolbar,bool param_3)

{
  QLayoutItem *item;
  uint uVar1;
  DockPosition DVar2;
  
  uVar1 = 3;
  if (area - LeftToolBarArea < 8) {
    uVar1 = *(int *)(&DAT_006e8c30 + (ulong)(area - LeftToolBarArea) * 4) - 1;
  }
  QLayout::addChildWidget((QLayout *)this,&toolbar->super_QWidget);
  DVar2 = DockCount;
  if (uVar1 < 8) {
    DVar2 = *(DockPosition *)(&DAT_006e8c50 + (ulong)uVar1 * 4);
  }
  item = QToolBarAreaLayout::addToolBar((QToolBarAreaLayout *)(this + 0xa0),DVar2,toolbar);
  if (((item != (QLayoutItem *)0x0) && (*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8))) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    DVar2 = DockCount;
    if (uVar1 < 8) {
      DVar2 = *(DockPosition *)(&DAT_006e8c50 + (ulong)uVar1 * 4);
    }
    QToolBarAreaLayout::insertItem((QToolBarAreaLayout *)(this + 0x3d8),DVar2,item);
  }
  (**(code **)(*(long *)this + 0x70))(this);
  QToolBarPrivate::updateWindowFlags
            (*(QToolBarPrivate **)&(toolbar->super_QWidget).field_0x8,false,false);
  return;
}

Assistant:

void QMainWindowLayout::addToolBar(Qt::ToolBarArea area,
                                   QToolBar *toolbar,
                                   bool)
{
    area = validateToolBarArea(area);
    // let's add the toolbar to the layout
    addChildWidget(toolbar);
    QLayoutItem *item = layoutState.toolBarAreaLayout.addToolBar(toDockPos(area), toolbar);
    if (savedState.isValid() && item) {
        // copy the toolbar also in the saved state
        savedState.toolBarAreaLayout.insertItem(toDockPos(area), item);
    }
    invalidate();

    // this ensures that the toolbar has the right window flags (not floating any more)
    toolbar->d_func()->updateWindowFlags(false /*floating*/);
}